

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void compact_alphabet(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  bool bVar1;
  reference puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *__lhs;
  reference pvVar3;
  reference puVar4;
  byte *pbVar5;
  undefined8 in_RDI;
  uint *x;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_2;
  uchar *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_1;
  uint32_t cur;
  uint *v;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> elems;
  uint32_t max_elem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  int local_7c;
  reference local_78;
  uint *local_70;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  undefined8 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uint *local_28;
  uint *local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  uint local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_20 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff28);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff28);
  local_18 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_18);
  local_c = *puVar2;
  __lhs = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *)(ulong)(local_c + 1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x17667c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff50._M_current,(size_type)in_stack_ffffffffffffff48._M_current,
             (allocator_type *)in_stack_ffffffffffffff40._M_current);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1766a2);
  local_60 = local_8;
  local_68._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff28);
  local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    local_78 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_68);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_40,(ulong)*local_78);
    *pvVar3 = '\x01';
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_68);
  }
  local_7c = 0;
  local_88 = &local_40;
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (in_stack_ffffffffffffff28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)__lhs,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_90);
    if (*puVar4 != '\0') {
      *puVar4 = (uchar)local_7c;
      local_7c = local_7c + 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_90);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    in_stack_ffffffffffffff40._M_current =
         __gnu_cxx::
         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
         ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&stack0xffffffffffffff50);
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_40,(ulong)*in_stack_ffffffffffffff40._M_current);
    *in_stack_ffffffffffffff40._M_current = (uint)*pbVar5;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)&stack0xffffffffffffff50);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff40._M_current);
  return;
}

Assistant:

void compact_alphabet(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<uint8_t> elems(max_elem + 1);
    for (const auto& v : vec)
        elems[v] = 1;
    uint32_t cur = 0;
    for (auto& v : elems) {
        if (v != 0) {
            v = cur;
            cur++;
        }
    }
    for (auto& x : vec)
        x = elems[x];
}